

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O1

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNull<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  Ch *pCVar1;
  char *pcVar2;
  Ch *pCVar3;
  
  pCVar1 = is->src_;
  is->src_ = pCVar1 + 1;
  if (((pCVar1[1] == 'u') && (is->src_ = pCVar1 + 2, pCVar1[2] == 'l')) &&
     (is->src_ = pCVar1 + 3, pCVar1[3] == 'l')) {
    is->src_ = pCVar1 + 4;
    if ((long)(handler->stack_).stackEnd_ - (long)(handler->stack_).stackTop_ < 0x10) {
      internal::Stack<rapidjson::CrtAllocator>::
      Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                (&handler->stack_,1);
    }
    pcVar2 = (handler->stack_).stackTop_;
    (handler->stack_).stackTop_ = pcVar2 + 0x10;
    pcVar2[0] = '\0';
    pcVar2[1] = '\0';
    pcVar2[2] = '\0';
    pcVar2[3] = '\0';
    pcVar2[4] = '\0';
    pcVar2[5] = '\0';
    pcVar2[6] = '\0';
    pcVar2[7] = '\0';
    pcVar2[8] = '\0';
    pcVar2[9] = '\0';
    pcVar2[10] = '\0';
    pcVar2[0xb] = '\0';
    pcVar2[0xc] = '\0';
    pcVar2[0xd] = '\0';
    pcVar2[0xe] = '\0';
    pcVar2[0xf] = '\0';
    return;
  }
  pCVar1 = is->src_;
  pCVar3 = is->head_;
  *(undefined4 *)(this + 0x30) = 3;
  *(long *)(this + 0x38) = (long)pCVar1 - (long)pCVar3;
  return;
}

Assistant:

Ch Take() { return *src_++; }